

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void redraw_overlays(void)

{
  Fl_Type **ppFVar1;
  int iVar2;
  Fl_Type *pFVar3;
  
  pFVar3 = Fl_Type::first;
  if (Fl_Type::first != (Fl_Type *)0x0) {
    do {
      iVar2 = (*pFVar3->_vptr_Fl_Type[0x21])(pFVar3);
      if (iVar2 != 0) {
        Main_Menu[0x28].text = "Hide O&verlays";
        overlays_invisible = 0;
        pFVar3[2].new_selected = '\x01';
        pFVar3[2].selected = '\0';
        pFVar3[2].open_ = '\0';
        pFVar3[2].visible = '\0';
        Fl_Overlay_Window::redraw_overlay((Fl_Overlay_Window *)pFVar3[1].prev);
      }
      ppFVar1 = &pFVar3->next;
      pFVar3 = *ppFVar1;
    } while (*ppFVar1 != (Fl_Type *)0x0);
  }
  return;
}

Assistant:

void redraw_overlays() {
  for (Fl_Type *o=Fl_Type::first; o; o=o->next)
    if (o->is_window()) ((Fl_Window_Type*)o)->fix_overlay();
}